

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void MetricsHelpMarker(char *desc)

{
  bool bVar1;
  char *in_RDI;
  
  ImGui::TextDisabled("(?)");
  bVar1 = ImGui::BeginItemTooltip();
  if (bVar1) {
    ImGui::GetFontSize();
    ImGui::PushTextWrapPos(desc._4_4_);
    ImGui::TextUnformatted(desc,in_RDI);
    ImGui::PopTextWrapPos();
    ImGui::EndTooltip();
  }
  return;
}

Assistant:

static void MetricsHelpMarker(const char* desc)
{
    ImGui::TextDisabled("(?)");
    if (ImGui::BeginItemTooltip())
    {
        ImGui::PushTextWrapPos(ImGui::GetFontSize() * 35.0f);
        ImGui::TextUnformatted(desc);
        ImGui::PopTextWrapPos();
        ImGui::EndTooltip();
    }
}